

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O3

size_t ts_subtree__write_to_string
                 (Subtree self,char *string,size_t limit,TSLanguage *language,_Bool is_root,
                 _Bool include_all,TSSymbol alias_symbol,_Bool alias_is_named)

{
  Subtree self_00;
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  ushort **ppuVar7;
  _Bool alias_is_named_00;
  char *pcVar8;
  char *pcVar9;
  TSSymbol *pTVar10;
  char *pcVar11;
  char cVar12;
  ulong uVar13;
  
  if (self.ptr == (SubtreeHeapData *)0x0) {
    iVar2 = snprintf(string,limit,"(NULL)");
    return (long)iVar2;
  }
  cVar12 = '\x01';
  if (!is_root && !include_all) {
    if (((ulong)self.ptr & 1) == 0) {
      uVar1 = *(ushort *)&(self.ptr)->field_0x2c;
      if (-1 < (char)uVar1) {
        if ((uVar1 & 1) != 0) {
          uVar3 = (uint)(uVar1 >> 1);
          goto LAB_0013437a;
        }
        goto LAB_00134381;
      }
    }
    else if (((ulong)self.ptr & 0x20) == 0) {
      if (((ulong)self.ptr & 2) != 0) {
        uVar3 = (uint)((ulong)self.ptr >> 2) & 0x3fffffff;
LAB_0013437a:
        if ((uVar3 & 1) != 0) goto LAB_00134386;
      }
LAB_00134381:
      cVar12 = alias_is_named;
    }
  }
LAB_00134386:
  pcVar11 = string;
  if (cVar12 == '\x01' && !is_root) {
    iVar2 = snprintf(string,limit," ");
    pcVar11 = string + iVar2;
  }
  if (cVar12 == '\0') {
    if (((ulong)self.ptr & 1) != 0) goto LAB_00134668;
LAB_0013451a:
    if ((self.ptr)->child_count != 0) {
      uVar5 = (ulong)((self.ptr)->field_17).field_0.alias_sequence_id;
      if (uVar5 == 0) {
        pTVar10 = (TSSymbol *)0x0;
      }
      else {
        pTVar10 = language->alias_sequences + language->max_alias_sequence_length * uVar5;
      }
      uVar13 = 0;
      uVar5 = 0;
      do {
        self_00 = ((self.ptr)->field_17).field_0.children[uVar13];
        if (((ulong)self_00.ptr & 1) == 0) {
          uVar3 = *(uint *)&(self_00.ptr)->field_0x2c >> 2;
        }
        else {
          uVar3 = (uint)((ulong)self_00.ptr >> 3) & 0x1fffffff;
        }
        if ((uVar3 & 1) == 0) {
          pcVar8 = pcVar11;
          if (pTVar10 == (TSSymbol *)0x0) {
            if (limit == 0) {
              pcVar8 = string;
            }
            uVar1 = 0;
            alias_is_named_00 = false;
          }
          else {
            uVar1 = pTVar10[uVar5];
            if (limit == 0) {
              pcVar8 = string;
            }
            alias_is_named_00 = false;
            if ((uVar1 != 0) && (alias_is_named_00 = false, uVar1 != 0xfffe)) {
              if (uVar1 == 0xffff) {
                alias_is_named_00 = true;
              }
              else {
                alias_is_named_00 = (_Bool)(((byte)language->symbol_metadata[uVar1] & 2) >> 1);
              }
            }
          }
          sVar6 = ts_subtree__write_to_string
                            (self_00,pcVar8,limit,language,false,include_all,uVar1,alias_is_named_00
                            );
          uVar5 = (ulong)((int)uVar5 + 1);
        }
        else {
          pcVar8 = pcVar11;
          if (limit == 0) {
            pcVar8 = string;
          }
          sVar6 = ts_subtree__write_to_string
                            (self_00,pcVar8,limit,language,false,include_all,0,false);
        }
        pcVar11 = pcVar11 + sVar6;
        uVar13 = uVar13 + 1;
      } while (uVar13 < (self.ptr)->child_count);
    }
    if (cVar12 == '\0') goto LAB_00134668;
  }
  else {
    if (((ulong)self.ptr & 1) == 0) {
      if ((((self.ptr)->symbol == 0xffff) && ((self.ptr)->child_count == 0)) &&
         (((self.ptr)->size).bytes != 0)) {
        pcVar8 = pcVar11;
        if (limit == 0) {
          pcVar8 = string;
        }
        iVar2 = snprintf(pcVar8,limit,"(UNEXPECTED ");
        pcVar8 = pcVar11 + iVar2;
        if (limit == 0) {
          pcVar8 = string;
        }
        uVar3 = ((self.ptr)->field_17).lookahead_char;
        if ((long)(int)uVar3 < 9) {
          if (uVar3 == 0xffffffff) {
            pcVar9 = "INVALID";
            goto LAB_001346aa;
          }
          if (uVar3 == 0) {
            pcVar9 = "EOF";
            goto LAB_001346aa;
          }
LAB_001346cb:
          if ((uVar3 < 0x80) &&
             (ppuVar7 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar7 + (long)(int)uVar3 * 2 + 1) & 0x40) != 0)) {
            pcVar9 = "consume character:\'%c\'";
          }
          else {
            pcVar9 = "consume character:%d";
          }
          iVar4 = snprintf(pcVar8,limit,pcVar9 + 0x12,(ulong)uVar3);
        }
        else {
          if (uVar3 == 9) {
            pcVar9 = "\'\\t\'";
          }
          else if (uVar3 == 10) {
            pcVar9 = "\'\\n\'";
          }
          else {
            if (uVar3 != 0xd) goto LAB_001346cb;
            pcVar9 = "\'\\r\'";
          }
LAB_001346aa:
          iVar4 = snprintf(pcVar8,limit,pcVar9);
        }
        pcVar11 = pcVar11 + iVar2 + iVar4;
        goto LAB_0013451a;
      }
      uVar3 = *(uint *)&(self.ptr)->field_0x2c >> 7;
    }
    else {
      uVar3 = (uint)((ulong)self.ptr >> 5) & 0x7ffffff;
    }
    if ((uVar3 & 1) == 0) {
      if (alias_symbol == 0) {
        if (((ulong)self.ptr & 1) == 0) {
          alias_symbol = (self.ptr)->symbol;
        }
        else {
          alias_symbol = (TSSymbol)self.data.symbol;
        }
      }
      if (alias_symbol == 0xffff) {
        pcVar8 = "ERROR";
      }
      else if (alias_symbol == 0xfffe) {
        pcVar8 = "_ERROR";
      }
      else {
        pcVar8 = language->symbol_names[alias_symbol];
      }
      pcVar9 = pcVar11;
      if (limit == 0) {
        pcVar9 = string;
      }
      iVar2 = snprintf(pcVar9,limit,"(%s",pcVar8);
    }
    else {
      pcVar8 = pcVar11;
      if (limit == 0) {
        pcVar8 = string;
      }
      iVar2 = snprintf(pcVar8,limit,"(MISSING");
    }
    pcVar11 = pcVar11 + iVar2;
    if (((ulong)self.ptr & 1) == 0) goto LAB_0013451a;
  }
  pcVar8 = pcVar11;
  if (limit == 0) {
    pcVar8 = string;
  }
  iVar2 = snprintf(pcVar8,limit,")");
  pcVar11 = pcVar11 + iVar2;
LAB_00134668:
  return (long)pcVar11 - (long)string;
}

Assistant:

static size_t ts_subtree__write_to_string(Subtree self, char *string, size_t limit,
                                          const TSLanguage *language, bool is_root,
                                          bool include_all, TSSymbol alias_symbol,
                                          bool alias_is_named) {
  if (!self.ptr) return snprintf(string, limit, "(NULL)");

  char *cursor = string;
  char **writer = (limit > 0) ? &cursor : &string;
  bool visible =
    include_all ||
    is_root ||
    ts_subtree_missing(self) ||
    (ts_subtree_visible(self) && ts_subtree_named(self)) ||
    alias_is_named;

  if (visible && !is_root) {
    cursor += snprintf(*writer, limit, " ");
  }

  if (visible) {
    if (ts_subtree_is_error(self) && ts_subtree_child_count(self) == 0 && self.ptr->size.bytes > 0) {
      cursor += snprintf(*writer, limit, "(UNEXPECTED ");
      cursor += ts_subtree__write_char_to_string(*writer, limit, self.ptr->lookahead_char);
    } else if (ts_subtree_missing(self)) {
      cursor += snprintf(*writer, limit, "(MISSING");
    } else {
      TSSymbol symbol = alias_symbol ? alias_symbol : ts_subtree_symbol(self);
      const char *symbol_name = ts_language_symbol_name(language, symbol);
      cursor += snprintf(*writer, limit, "(%s", symbol_name);
    }
  }

  if (ts_subtree_child_count(self)) {
    const TSSymbol *alias_sequence = ts_language_alias_sequence(language, self.ptr->alias_sequence_id);
    uint32_t structural_child_index = 0;
    for (uint32_t i = 0; i < self.ptr->child_count; i++) {
      Subtree child = self.ptr->children[i];
      if (ts_subtree_extra(child)) {
        cursor += ts_subtree__write_to_string(
          child, *writer, limit,
          language, false, include_all,
          0, false
        );
      } else {
        TSSymbol alias_symbol = alias_sequence ? alias_sequence[structural_child_index] : 0;
        cursor += ts_subtree__write_to_string(
          child, *writer, limit,
          language, false, include_all,
          alias_symbol,
          alias_symbol ? ts_language_symbol_metadata(language, alias_symbol).named : false
        );
        structural_child_index++;
      }
    }
  }

  if (visible) cursor += snprintf(*writer, limit, ")");

  return cursor - string;
}